

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensor.cpp
# Opt level: O1

void __thiscall LidarSensor::LidarSensor(LidarSensor *this,string *name,VectorXd *noise,int debug)

{
  pointer pcVar1;
  string local_48;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + name->_M_string_length);
  Sensor::Sensor(&this->super_Sensor,&local_48,noise,2,debug);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  (this->super_Sensor)._vptr_Sensor = (_func_int **)&PTR__Sensor_0014fc70;
  return;
}

Assistant:

LidarSensor::LidarSensor(string name, const VectorXd& noise, int debug) :
        Sensor(name, noise, 2, debug)
{}